

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

void gl4cts::anon_unknown_0::Output(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &args[0].overflow_arg_area;
  local_e8 = 0x3000000008;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  vsnprintf(Output::temp,39999,format,&local_e8);
  Output::temp[39999] = '\0';
  pcVar1 = Output::temp;
  while( true ) {
    pcVar1 = strtok(pcVar1,"\n");
    if (pcVar1 == (char *)0x0) break;
    tcu::TestLog::writeMessage(gl4cts::(anonymous_namespace)::currentLog,pcVar1);
    pcVar1 = (char *)0x0;
  }
  return;
}

Assistant:

void Output(const char* format, ...)
{
	va_list args;
	va_start(args, format);

	const int   MAX_OUTPUT_STRING_SIZE = 40000;
	static char temp[MAX_OUTPUT_STRING_SIZE];

	vsnprintf(temp, MAX_OUTPUT_STRING_SIZE - 1, format, args);
	temp[MAX_OUTPUT_STRING_SIZE - 1] = '\0';

	char* logLine = strtok(temp, "\n");
	while (logLine != NULL)
	{
		currentLog->writeMessage(logLine);
		logLine = strtok(NULL, "\n");
	}
	va_end(args);
}